

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

void __thiscall
charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
::initialize_quantization_lut
          (jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
           *this)

{
  int8_t iVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  ulong local_30;
  size_t i;
  int32_t range;
  jpegls_pc_parameters presets;
  jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
  *this_local;
  
  presets._12_8_ = this;
  if (((((this->traits_).near_lossless == 0) &&
       ((this->traits_).maximum_sample_value ==
        (1 << ((byte)(this->traits_).bits_per_pixel & 0x1f)) + -1)) &&
      (compute_default((jpegls_pc_parameters *)((long)&i + 4),(this->traits_).maximum_sample_value,
                       (this->traits_).near_lossless), range == this->t1_)) &&
     ((presets.maximum_sample_value == this->t2_ && (presets.threshold1 == this->t3_)))) {
    if ((this->traits_).bits_per_pixel == 8) {
      sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                        ((vector<signed_char,_std::allocator<signed_char>_> *)
                         quantization_lut_lossless_8);
      pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)
                          quantization_lut_lossless_8,sVar2 >> 1);
      this->quantization_ = pvVar3;
      return;
    }
    if ((this->traits_).bits_per_pixel == 10) {
      sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                        ((vector<signed_char,_std::allocator<signed_char>_> *)
                         quantization_lut_lossless_10);
      pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)
                          quantization_lut_lossless_10,sVar2 >> 1);
      this->quantization_ = pvVar3;
      return;
    }
    if ((this->traits_).bits_per_pixel == 0xc) {
      sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                        ((vector<signed_char,_std::allocator<signed_char>_> *)
                         quantization_lut_lossless_12);
      pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)
                          quantization_lut_lossless_12,sVar2 >> 1);
      this->quantization_ = pvVar3;
      return;
    }
    if ((this->traits_).bits_per_pixel == 0x10) {
      sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                        ((vector<signed_char,_std::allocator<signed_char>_> *)
                         quantization_lut_lossless_16);
      pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)
                          quantization_lut_lossless_16,sVar2 >> 1);
      this->quantization_ = pvVar3;
      return;
    }
  }
  i._0_4_ = 1 << ((byte)(this->traits_).bits_per_pixel & 0x1f);
  std::vector<signed_char,_std::allocator<signed_char>_>::resize
            (&this->quantization_lut_,(long)(int)i << 1);
  for (local_30 = 0;
      sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&this->quantization_lut_)
      , local_30 < sVar2; local_30 = local_30 + 1) {
    iVar1 = quantize_gradient_org(this,(int)local_30 - (int)i);
    pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (&this->quantization_lut_,local_30);
    *pvVar4 = iVar1;
  }
  pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                     (&this->quantization_lut_,(long)(int)i);
  this->quantization_ = pvVar4;
  return;
}

Assistant:

void initialize_quantization_lut()
    {
        // for lossless mode with default parameters, we have precomputed the look up table for bit counts 8, 10, 12 and 16.
        if (traits_.near_lossless == 0 && traits_.maximum_sample_value == (1 << traits_.bits_per_pixel) - 1)
        {
            const jpegls_pc_parameters presets{compute_default(traits_.maximum_sample_value, traits_.near_lossless)};
            if (presets.threshold1 == t1_ && presets.threshold2 == t2_ && presets.threshold3 == t3_)
            {
                if (traits_.bits_per_pixel == 8)
                {
                    quantization_ = &quantization_lut_lossless_8[quantization_lut_lossless_8.size() / 2];
                    return;
                }
                if (traits_.bits_per_pixel == 10)
                {
                    quantization_ = &quantization_lut_lossless_10[quantization_lut_lossless_10.size() / 2];
                    return;
                }
                if (traits_.bits_per_pixel == 12)
                {
                    quantization_ = &quantization_lut_lossless_12[quantization_lut_lossless_12.size() / 2];
                    return;
                }
                if (traits_.bits_per_pixel == 16)
                {
                    quantization_ = &quantization_lut_lossless_16[quantization_lut_lossless_16.size() / 2];
                    return;
                }
            }
        }

        // Initialize the quantization lookup table dynamic.
        const int32_t range{1 << traits_.bits_per_pixel};
        quantization_lut_.resize(static_cast<size_t>(range) * 2);
        for (size_t i{}; i < quantization_lut_.size(); ++i)
        {
            quantization_lut_[i] = quantize_gradient_org(-range + static_cast<int32_t>(i));
        }

        quantization_ = &quantization_lut_[range];
    }